

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O0

ByteArray<100UL>
supermap::io::DeserializeHelper<supermap::ByteArray<100UL>,_void>::deserialize(istream *is)

{
  byte bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_RSI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> in_RDI;
  ByteArray<100UL> *ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  long in_stack_ffffffffffffff48;
  string local_48 [55];
  undefined1 local_11;
  char *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ByteArray<100UL>::ByteArray((ByteArray<100UL> *)0x129191);
  pcVar2 = ByteArray<100UL>::getCharsPointer((ByteArray<100UL> *)0x1291a8);
  std::istream::read(local_10,(long)pcVar2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    return (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           in_RDI._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  uVar3 = 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff38);
  std::operator+((char *)__lhs,in_stack_ffffffffffffff00);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
  std::istream::gcount();
  std::__cxx11::to_string(in_stack_ffffffffffffff48);
  std::operator+(in_stack_ffffffffffffff38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffff30));
  supermap::IOException::IOException((IOException *)__lhs,local_48);
  __cxa_throw(__lhs,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

static ByteArray<Len> deserialize(std::istream &is) {
        ByteArray<Len> ar;
        is.read(ar.getCharsPointer(), Len);
        if (!is.good()) {
            throw IOException(
                "Unsuccessful deserialization, expected to read " + std::to_string(Len) +
                    " bytes, but read only " + std::to_string(is.gcount()));
        }
        return ar;
    }